

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedFallback
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  long *plVar1;
  long lVar2;
  void *pvVar3;
  SerialArena *pSVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  
  if ((*(ulong *)(this + 8) & 2) != 0) {
    plVar1 = *(long **)((*(ulong *)(this + 8) & 0xfffffffffffffff8) + 0x20);
    (**(code **)(*plVar1 + 0x10))(plVar1,type,n);
    lVar2 = *in_FS_OFFSET;
    if (*(long *)(lVar2 + -0x38) == *(long *)this) {
      pSVar4 = *(SerialArena **)(lVar2 + -0x30);
      bVar5 = true;
    }
    else {
      pSVar4 = *(SerialArena **)(this + 0x18);
      if (pSVar4 == (SerialArena *)0x0) {
        bVar5 = false;
      }
      else {
        bVar5 = pSVar4->owner_ == (void *)(lVar2 + -0x40);
      }
    }
    if (bVar5) {
      pvVar3 = SerialArena::AllocateAligned
                         (pSVar4,n,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8));
      return pvVar3;
    }
  }
  pSVar4 = GetSerialArenaFallback(this,(void *)(*in_FS_OFFSET + -0x40));
  pvVar3 = SerialArena::AllocateAligned
                     (pSVar4,n,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8));
  return pvVar3;
}

Assistant:

PROTOBUF_NOINLINE
void* ThreadSafeArena::AllocateAlignedFallback(size_t n,
                                               const std::type_info* type) {
  if (alloc_policy_.should_record_allocs()) {
    alloc_policy_.RecordAlloc(type, n);
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned(n, alloc_policy_.get());
    }
  }
  return GetSerialArenaFallback(&thread_cache())
      ->AllocateAligned(n, alloc_policy_.get());
}